

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

int Fl_Plugin_Manager::loadAll(char *filepath,char *pattern)

{
  dirent *__ptr;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  dirent **dir;
  Name local_40;
  dirent **local_38;
  
  uVar1 = fl_filename_list(filepath,&local_38,fl_numericsort);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar1 == uVar3) {
      free(local_38);
      return 0;
    }
    __ptr = local_38[uVar3];
    if (pattern == (char *)0x0) {
LAB_001c34aa:
      Fl_Preferences::Name::Name(&local_40,"%s%s",filepath,__ptr->d_name);
      load(local_40.data_);
      Fl_Preferences::Name::~Name(&local_40);
    }
    else {
      iVar2 = fl_filename_match(__ptr->d_name,pattern);
      if (iVar2 != 0) goto LAB_001c34aa;
    }
    free(__ptr);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Fl_Plugin_Manager::loadAll(const char *filepath, const char *pattern) {
  struct dirent **dir;
  int i, n = fl_filename_list(filepath, &dir);
  for (i=0; i<n; i++) {
    struct dirent *e = dir[i];
    if (pattern==0 || fl_filename_match(e->d_name, pattern)) {
      load(Fl_Preferences::Name("%s%s", filepath, e->d_name));
    }
    free(e);
  }
  free(dir);
  return 0;
}